

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall ParserProbModelXML::Parse(ParserProbModelXML *this)

{
  xmlXPathContextPtr pxVar1;
  ParserProbModelXML *in_RDI;
  ParserProbModelXML *unaff_retaddr;
  E *e;
  ProbModelXMLObservationProbFunctor of;
  ProbModelXMLTransitionProbFunctor tf;
  ProbModelXMLScopeFunctor sf;
  ParserProbModelXML *in_stack_00000070;
  ParserProbModelXML *in_stack_00000360;
  ParserProbModelXML *in_stack_000003c0;
  ParserProbModelXML *in_stack_000004d0;
  ParserProbModelXML *in_stack_00000640;
  FactoredDecPOMDPDiscrete *in_stack_ffffffffffffff80;
  ProbModelXMLObservationProbFunctor *in_stack_ffffffffffffff90;
  undefined1 local_68 [32];
  undefined1 local_48 [24];
  undefined1 local_30 [16];
  ParserProbModelXML *in_stack_ffffffffffffffe0;
  
  xmlInitParser();
  InitializeXPath(in_stack_ffffffffffffffe0);
  ReadProperties((ParserProbModelXML *)of.super_ObservationProbFunctor._vptr_ObservationProbFunctor)
  ;
  ReadAgents(in_stack_ffffffffffffffe0);
  ReadStates(in_stack_00000070);
  ReadActions(in_stack_00000360);
  ReadObservations(in_stack_000004d0);
  InitializeLRFs(unaff_retaddr);
  anon_unknown.dwarf_8c6fd8::ProbModelXMLScopeFunctor::ProbModelXMLScopeFunctor
            ((ProbModelXMLScopeFunctor *)in_stack_ffffffffffffff90,in_RDI,in_stack_ffffffffffffff80)
  ;
  anon_unknown.dwarf_8c6fd8::ProbModelXMLTransitionProbFunctor::ProbModelXMLTransitionProbFunctor
            ((ProbModelXMLTransitionProbFunctor *)in_stack_ffffffffffffff90,in_RDI,
             in_stack_ffffffffffffff80);
  anon_unknown.dwarf_8c6fd8::ProbModelXMLObservationProbFunctor::ProbModelXMLObservationProbFunctor
            (in_stack_ffffffffffffff90,in_RDI,in_stack_ffffffffffffff80);
  MultiAgentDecisionProcessDiscreteFactoredStates::SetEventObservability
            (&in_RDI->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates,
             (bool)(in_RDI->_m_asynchronousModel & 1));
  (**(code **)(*(long *)&(in_RDI->_m_fDecPOMDP->
                         super_MultiAgentDecisionProcessDiscreteFactoredStates).
                         super_MultiAgentDecisionProcess + 0x248))
            (in_RDI->_m_fDecPOMDP,local_30,local_48,local_68);
  SetISD(in_stack_000003c0);
  ReadLRFs(in_stack_00000640);
  pxVar1 = GetContext(in_RDI);
  xmlXPathFreeContext(pxVar1);
  xmlCleanupParser();
  return;
}

Assistant:

void ParserProbModelXML::Parse()
{   
#ifdef HAVE_LIBXML2
    xmlInitParser(); 
    //Parse
    try{
        InitializeXPath();
        ReadProperties();
        ReadAgents();
        ReadStates();
        ReadActions();
        ReadObservations();
        InitializeLRFs();

        ProbModelXMLScopeFunctor sf(this,_m_fDecPOMDP);
        ProbModelXMLTransitionProbFunctor tf(this,_m_fDecPOMDP);
        ProbModelXMLObservationProbFunctor of(this,_m_fDecPOMDP);
        _m_fDecPOMDP->SetEventObservability(_m_asynchronousModel);
        _m_fDecPOMDP->Initialize2DBN(sf,tf,of);
        SetISD();
        ReadLRFs();

        xmlXPathFreeContext(GetContext());

      if(DEBUG_PARSE) cout << ">>>Parsing succeeded\n";
    }    
    catch(E& e)
    {
        e.Print();
    }
    xmlCleanupParser();
    if(DEBUG_PARSE)  cout << "-------------------------\n";
#else

    throw(E("ParserProbModelXML: not compiled with libxml2 support"));
#endif

    return;
}